

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

RootSymbol * __thiscall
slang::ast::Compilation::getRoot(Compilation *this,bool skipDefParamResolution)

{
  flat_hash_set<string_view> *this_00;
  size_t *psVar1;
  EntryPointer psVar2;
  EntryPointer psVar3;
  sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>
  *psVar4;
  long *plVar5;
  pointer psVar6;
  _Tuple_impl<0UL,_slang::parsing::ParserMetadata_*,_std::default_delete<slang::parsing::ParserMetadata>_>
  _Var7;
  EntryPointer psVar8;
  size_t sVar9;
  RootSymbol *pRVar10;
  basic_string_view<char,_std::char_traits<char>_> *key;
  size_type sVar11;
  EntryPointer psVar12;
  pointer ppDVar13;
  char *pcVar14;
  ConstantValue *args;
  Definition *pDVar15;
  pointer ppCVar16;
  pointer ppCVar17;
  string_view arg;
  int iVar18;
  shared_ptr<slang::syntax::SyntaxTree> *tree;
  pointer psVar19;
  iterator iVar20;
  iterator iVar21;
  _Head_base<0UL,_slang::ast::Definition_*,_false> _Var22;
  Diagnostic *pDVar23;
  ulong uVar24;
  iterator iVar25;
  InstanceSymbol *pIVar26;
  undefined4 extraout_var;
  int8_t iVar27;
  _Head_base<1UL,_const_slang::ast::Scope_*,_false> _Var28;
  long lVar29;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  EVP_PKEY_CTX *extraout_RDX_04;
  EVP_PKEY_CTX *extraout_RDX_05;
  EVP_PKEY_CTX *extraout_RDX_06;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_07;
  EVP_PKEY_CTX *extraout_RDX_08;
  EVP_PKEY_CTX *extraout_RDX_09;
  EVP_PKEY_CTX *extraout_RDX_10;
  size_type extraout_RDX_11;
  long *plVar30;
  sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>
  *psVar31;
  pointer ppDVar32;
  ParameterDecl *param;
  ParameterDecl *this_01;
  EntryPointer psVar33;
  ParamOverrideNode *paramOverrideNode;
  ParameterDecl *local_R12;
  pointer this_02;
  pointer ppDVar34;
  SourceLocation SVar35;
  sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>
  *psVar36;
  Definition **__i;
  EntryPointer psVar37;
  long lVar38;
  bool bVar39;
  pair<ska::detailv3::sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>::templated_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_bool>
  pVar40;
  pair<ska::detailv3::sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>_>_>_>::templated_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>_>,_bool>
  pVar41;
  flat_hash_map<string_view,_const_ConstantValue_*> cliOverrides;
  SmallVector<const_slang::ast::Definition_*,_5UL> topDefs;
  SmallVector<const_slang::ast::InstanceSymbol_*,_5UL> topList;
  BindVisitor visitor;
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>_>_>
  local_110;
  long *local_f0;
  ulong local_e8;
  undefined8 local_e0;
  long local_d8 [5];
  undefined1 local_b0 [16];
  undefined1 local_a0 [48];
  SourceLocation local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [40];
  
  if (this->finalized == true) {
    return (this->root)._M_t.
           super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
           ._M_t.
           super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
           .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
  }
  local_110.entries =
       ska::detailv3::
       empty_default_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ConstantValue_const*>>
                 ();
  local_110.num_slots_minus_one = 0;
  local_110.hash_policy.shift = '?';
  local_110.max_lookups = '\x03';
  local_110._max_load_factor = 0.5;
  local_110.num_elements = 0;
  parseParamOverrides(this,(flat_hash_map<string_view,_const_ConstantValue_*> *)&local_110);
  psVar19 = (this->syntaxTrees).
            super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar6 = (this->syntaxTrees).
           super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar19 == psVar6) {
    SVar35 = (SourceLocation)0x0;
  }
  else {
    lVar29 = 0;
    SVar35 = (SourceLocation)0x0;
    do {
      _Var7.super__Head_base<0UL,_slang::parsing::ParserMetadata_*,_false>._M_head_impl =
           (((psVar19->super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->metadata)._M_t.
           super___uniq_ptr_impl<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>
           ._M_t.
           super__Tuple_impl<0UL,_slang::parsing::ParserMetadata_*,_std::default_delete<slang::parsing::ParserMetadata>_>
           .super__Head_base<0UL,_slang::parsing::ParserMetadata_*,_false>;
      lVar29 = lVar29 + (*(long *)((long)_Var7.
                                         super__Head_base<0UL,_slang::parsing::ParserMetadata_*,_false>
                                         ._M_head_impl + 0x78) -
                         *(long *)((long)_Var7.
                                         super__Head_base<0UL,_slang::parsing::ParserMetadata_*,_false>
                                         ._M_head_impl + 0x70) >> 3);
      SVar35 = (SourceLocation)
               ((long)SVar35 +
               (*(long *)((long)_Var7.super__Head_base<0UL,_slang::parsing::ParserMetadata_*,_false>
                                ._M_head_impl + 0xa8) -
                *(long *)((long)_Var7.super__Head_base<0UL,_slang::parsing::ParserMetadata_*,_false>
                                ._M_head_impl + 0xa0) >> 3));
      psVar19 = psVar19 + 1;
    } while (psVar19 != psVar6);
    if ((!skipDefParamResolution) && (lVar29 != 0)) {
      resolveDefParams(this,(size_t)_Var7.
                                    super__Head_base<0UL,_slang::parsing::ParserMetadata_*,_false>.
                                    _M_head_impl);
    }
  }
  if (this->finalizing == true) {
    assert::assertFailed
              ("!finalizing",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Compilation.cpp"
               ,0x111,"const RootSymbol &slang::ast::Compilation::getRoot(bool)");
  }
  this->finalizing = true;
  local_f0 = local_d8;
  local_e8 = 0;
  local_e0 = 5;
  psVar8 = (this->definitionMap).
           super_sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>_>_>
           .entries;
  local_70 = SVar35;
  if ((this->options).topModules.
      super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      .num_elements == 0) {
    lVar29 = 0;
    do {
      lVar38 = lVar29;
      lVar29 = lVar38 + 0x28;
    } while ((&psVar8->distance_from_desired)[lVar38] < '\0');
    sVar9 = (this->definitionMap).
            super_sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>_>_>
            .num_slots_minus_one;
    lVar29 = (long)(this->definitionMap).
                   super_sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>_>_>
                   .max_lookups;
    src = (EVP_PKEY_CTX *)(sVar9 * 5);
    if (lVar29 * 0x28 + sVar9 * 0x28 + 0x28 != lVar38 + 0x28) {
      psVar33 = (EntryPointer)(&psVar8->distance_from_desired + lVar38);
      do {
        pRVar10 = (this->root)._M_t.
                  super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                  .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
        _Var28._M_head_impl = &pRVar10->super_Scope;
        if (pRVar10 == (RootSymbol *)0x0) {
          _Var28._M_head_impl = (Scope *)0x0;
        }
        if ((Scope *)(psVar33->field_1).value.first.
                     super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                     .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                     super__Head_base<1UL,_const_slang::ast::Scope_*,_false> == _Var28._M_head_impl)
        {
          iVar20 = ska::detailv3::
                   sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                   ::find(&(this->globalInstantiations).
                           super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                          ,(basic_string_view<char,_std::char_traits<char>_> *)
                           (psVar33->field_1).value.second._M_t.
                           super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>
                           ._M_t);
          lVar38 = (long)(this->globalInstantiations).
                         super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                         .max_lookups;
          src = (EVP_PKEY_CTX *)(lVar38 * 3);
          if (iVar20.current ==
              (this->globalInstantiations).
              super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              .entries +
              (this->globalInstantiations).
              super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              .num_slots_minus_one + lVar38) {
            _Var22._M_head_impl = *(Definition **)((long)&psVar33->field_1 + 0x18);
            if ((((_Var22._M_head_impl)->syntaxTree == (SyntaxTree *)0x0) ||
                ((_Var22._M_head_impl)->syntaxTree->isLibrary == false)) &&
               ((_Var22._M_head_impl)->definitionKind == Module)) {
              sVar11 = ((_Var22._M_head_impl)->parameters).
                       super_SmallVectorBase<slang::ast::Definition::ParameterDecl>.len;
              if (sVar11 != 0) {
                this_02 = ((_Var22._M_head_impl)->parameters).
                          super_SmallVectorBase<slang::ast::Definition::ParameterDecl>.data_;
                lVar38 = sVar11 * 0x30;
                do {
                  bVar39 = Definition::ParameterDecl::hasDefault(this_02);
                  if (!bVar39) {
                    iVar21 = ska::detailv3::
                             sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>_>_>
                             ::find(&local_110,&this_02->name);
                    if (iVar21.current ==
                        local_110.entries +
                        local_110.num_slots_minus_one + (long)local_110.max_lookups) {
                      _Var22._M_head_impl =
                           *(Definition **)
                            &(psVar33->field_1).value.second._M_t.
                             super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>
                             ._M_t;
                      goto LAB_00226753;
                    }
                  }
                  this_02 = this_02 + 1;
                  lVar38 = lVar38 + -0x30;
                } while (lVar38 != 0);
                _Var22._M_head_impl =
                     *(Definition **)
                      &(psVar33->field_1).value.second._M_t.
                       super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>
                       ._M_t;
              }
              local_b0._0_8_ = _Var22._M_head_impl;
              SmallVectorBase<slang::ast::Definition_const*>::
              emplace_back<slang::ast::Definition_const*>
                        ((SmallVectorBase<slang::ast::Definition_const*> *)&local_f0,
                         (Definition **)local_b0);
              src = extraout_RDX_01;
            }
            else {
LAB_00226753:
              local_b0._0_8_ = _Var22._M_head_impl;
              std::
              vector<slang::ast::Definition_const*,std::allocator<slang::ast::Definition_const*>>::
              emplace_back<slang::ast::Definition_const*>
                        ((vector<slang::ast::Definition_const*,std::allocator<slang::ast::Definition_const*>>
                          *)&this->unreferencedDefs,(Definition **)local_b0);
              src = extraout_RDX_00;
            }
          }
        }
        do {
          psVar2 = psVar33 + 1;
          psVar33 = psVar33 + 1;
        } while (psVar2->distance_from_desired < '\0');
      } while (psVar33 != psVar8 + sVar9 + lVar29);
    }
  }
  else {
    this_00 = &(this->options).topModules;
    lVar29 = 0;
    do {
      lVar38 = lVar29;
      lVar29 = lVar38 + 0x28;
    } while ((&psVar8->distance_from_desired)[lVar38] < '\0');
    sVar9 = (this->definitionMap).
            super_sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>_>_>
            .num_slots_minus_one;
    lVar29 = (long)(this->definitionMap).
                   super_sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>_>_>
                   .max_lookups;
    if (lVar29 * 0x28 + sVar9 * 0x28 + 0x28 != lVar38 + 0x28) {
      psVar33 = (EntryPointer)(&psVar8->distance_from_desired + lVar38);
      do {
        pRVar10 = (this->root)._M_t.
                  super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                  .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
        _Var28._M_head_impl = &pRVar10->super_Scope;
        if (pRVar10 == (RootSymbol *)0x0) {
          _Var28._M_head_impl = (Scope *)0x0;
        }
        if ((Scope *)(psVar33->field_1).value.first.
                     super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                     .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                     super__Head_base<1UL,_const_slang::ast::Scope_*,_false> == _Var28._M_head_impl)
        {
          key = *(basic_string_view<char,_std::char_traits<char>_> **)
                 ((long)&psVar33->field_1 + 0x18);
          if ((*(int *)((long)&key[3]._M_len + 4) == 0) &&
             (iVar20 = ska::detailv3::
                       sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                       ::find(&this_00->
                               super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                              ,key),
             iVar20.current !=
             (this->options).topModules.
             super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             .entries +
             (this->options).topModules.
             super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             .num_slots_minus_one +
             (long)(this->options).topModules.
                   super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                   .max_lookups)) {
            (iVar20.current)->distance_from_desired = -1;
            psVar1 = &(this->options).topModules.
                      super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                      .num_elements;
            *psVar1 = *psVar1 - 1;
            iVar27 = iVar20.current[1].distance_from_desired;
            while ('\0' < iVar27) {
              pcVar14 = iVar20.current[1].field_1.value._M_str;
              ((iVar20.current)->field_1).value._M_len = iVar20.current[1].field_1.value._M_len;
              ((iVar20.current)->field_1).value._M_str = pcVar14;
              (iVar20.current)->distance_from_desired = iVar27 + -1;
              iVar20.current[1].distance_from_desired = -1;
              psVar12 = iVar20.current + 2;
              iVar20.current = iVar20.current + 1;
              iVar27 = psVar12->distance_from_desired;
            }
            _Var22._M_head_impl = *(Definition **)((long)&psVar33->field_1 + 0x18);
            sVar11 = *(size_type *)((long)&(_Var22._M_head_impl)->parameters + 8);
            if (sVar11 != 0) {
              this_01 = ((_Var22._M_head_impl)->parameters).
                        super_SmallVectorBase<slang::ast::Definition::ParameterDecl>.data_;
              lVar38 = sVar11 * 0x30;
              do {
                bVar39 = Definition::ParameterDecl::hasDefault(this_01);
                if (!bVar39) {
                  iVar21 = ska::detailv3::
                           sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>_>_>
                           ::find(&local_110,&this_01->name);
                  if (iVar21.current ==
                      local_110.entries +
                      local_110.num_slots_minus_one + (long)local_110.max_lookups) {
                    pDVar23 = Scope::addDiag(*(Scope **)
                                              ((long)(psVar33->field_1).value.second._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>
                                                  ._M_t + 0x28),(DiagCode)0xb000d,
                                             (SourceLocation)0xffffffffffffffff);
                    Diagnostic::operator<<
                              (pDVar23,**(string_view **)((long)&psVar33->field_1 + 0x18));
                    goto LAB_00226453;
                  }
                }
                this_01 = this_01 + 1;
                lVar38 = lVar38 + -0x30;
              } while (lVar38 != 0);
              _Var22._M_head_impl =
                   *(Definition **)
                    &(psVar33->field_1).value.second._M_t.
                     super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>
                     ._M_t;
            }
            local_b0._0_8_ = _Var22._M_head_impl;
            SmallVectorBase<slang::ast::Definition_const*>::
            emplace_back<slang::ast::Definition_const*>
                      ((SmallVectorBase<slang::ast::Definition_const*> *)&local_f0,
                       (Definition **)local_b0);
          }
          else {
LAB_00226453:
            iVar20 = ska::detailv3::
                     sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                     ::find(&(this->globalInstantiations).
                             super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                            ,(basic_string_view<char,_std::char_traits<char>_> *)
                             (psVar33->field_1).value.second._M_t.
                             super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>
                             ._M_t);
            if (iVar20.current ==
                (this->globalInstantiations).
                super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                .entries +
                (this->globalInstantiations).
                super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                .num_slots_minus_one +
                (long)(this->globalInstantiations).
                      super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                      .max_lookups) {
              local_b0._0_8_ =
                   (psVar33->field_1).value.second._M_t.
                   super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>
                   ._M_t;
              std::
              vector<slang::ast::Definition_const*,std::allocator<slang::ast::Definition_const*>>::
              emplace_back<slang::ast::Definition_const*>
                        ((vector<slang::ast::Definition_const*,std::allocator<slang::ast::Definition_const*>>
                          *)&this->unreferencedDefs,(Definition **)local_b0);
            }
          }
        }
        do {
          psVar2 = psVar33 + 1;
          psVar33 = psVar33 + 1;
        } while (psVar2->distance_from_desired < '\0');
      } while (psVar33 != psVar8 + sVar9 + lVar29);
    }
    psVar12 = (this_00->
              super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              ).entries;
    lVar29 = 0;
    do {
      lVar38 = lVar29;
      lVar29 = lVar38 + 0x18;
    } while ((&psVar12->distance_from_desired)[lVar38] < '\0');
    sVar9 = (this->options).topModules.
            super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            .num_slots_minus_one;
    lVar29 = (long)(this->options).topModules.
                   super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                   .max_lookups;
    src = (EVP_PKEY_CTX *)(sVar9 * 3);
    if (lVar29 * 0x18 + sVar9 * 0x18 + 0x18 != lVar38 + 0x18) {
      psVar37 = (EntryPointer)(&psVar12->distance_from_desired + lVar38);
      do {
        pDVar23 = Scope::addDiag(&((this->root)._M_t.
                                   super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                                   .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>.
                                  _M_head_impl)->super_Scope,(DiagCode)0xb000d,
                                 (SourceLocation)0xffffffffffffffff);
        arg._M_len = *(size_t *)&psVar37->field_1;
        arg._M_str = *(char **)((long)&psVar37->field_1 + 8);
        Diagnostic::operator<<(pDVar23,arg);
        do {
          psVar3 = psVar37 + 1;
          psVar37 = psVar37 + 1;
        } while (psVar3->distance_from_desired < '\0');
        src = extraout_RDX;
      } while (psVar37 != psVar12 + sVar9 + lVar29);
    }
  }
  uVar24 = local_e8;
  plVar5 = local_f0;
  if (local_e8 != 0) {
    plVar30 = local_f0 + local_e8;
    lVar29 = 0x3f;
    if (local_e8 != 0) {
      for (; local_e8 >> lVar29 == 0; lVar29 = lVar29 + -1) {
      }
    }
    std::
    __introsort_loop<slang::ast::Definition_const**,long,__gnu_cxx::__ops::_Iter_comp_iter<slang::ast::Compilation::getRoot(bool)::__2>>
              (local_f0,plVar30,((uint)lVar29 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)uVar24 < 0x11) {
      std::
      __insertion_sort<slang::ast::Definition_const**,__gnu_cxx::__ops::_Iter_comp_iter<slang::ast::Compilation::getRoot(bool)::__2>>
                (plVar5,plVar30);
      src = extraout_RDX_03;
    }
    else {
      plVar30 = plVar5 + 0x10;
      std::
      __insertion_sort<slang::ast::Definition_const**,__gnu_cxx::__ops::_Iter_comp_iter<slang::ast::Compilation::getRoot(bool)::__2>>
                (plVar5,plVar30);
      lVar29 = uVar24 * 8 + -0x80;
      do {
        std::
        __unguarded_linear_insert<slang::ast::Definition_const**,__gnu_cxx::__ops::_Val_comp_iter<slang::ast::Compilation::getRoot(bool)::__2>>
                  (plVar30);
        plVar30 = plVar30 + 1;
        lVar29 = lVar29 + -8;
        src = extraout_RDX_02;
      } while (lVar29 != 0);
    }
  }
  ppDVar32 = (this->unreferencedDefs).
             super__Vector_base<const_slang::ast::Definition_*,_std::allocator<const_slang::ast::Definition_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppDVar13 = (this->unreferencedDefs).
             super__Vector_base<const_slang::ast::Definition_*,_std::allocator<const_slang::ast::Definition_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppDVar32 != ppDVar13) {
    uVar24 = (long)ppDVar13 - (long)ppDVar32 >> 3;
    lVar29 = 0x3f;
    if (uVar24 != 0) {
      for (; uVar24 >> lVar29 == 0; lVar29 = lVar29 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<slang::ast::Definition_const**,std::vector<slang::ast::Definition_const*,std::allocator<slang::ast::Definition_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<slang::ast::Compilation::getRoot(bool)::__2>>
              (ppDVar32,ppDVar13,((uint)lVar29 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)ppDVar13 - (long)ppDVar32 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<slang::ast::Definition_const**,std::vector<slang::ast::Definition_const*,std::allocator<slang::ast::Definition_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<slang::ast::Compilation::getRoot(bool)::__2>>
                (ppDVar32,ppDVar13);
      src = extraout_RDX_06;
    }
    else {
      ppDVar34 = ppDVar32 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<slang::ast::Definition_const**,std::vector<slang::ast::Definition_const*,std::allocator<slang::ast::Definition_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<slang::ast::Compilation::getRoot(bool)::__2>>
                (ppDVar32,ppDVar34);
      src = extraout_RDX_04;
      for (; ppDVar34 != ppDVar13; ppDVar34 = ppDVar34 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<slang::ast::Definition_const**,std::vector<slang::ast::Definition_const*,std::allocator<slang::ast::Definition_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<slang::ast::Compilation::getRoot(bool)::__2>>
                  (ppDVar34);
        src = extraout_RDX_05;
      }
    }
  }
  if (local_110.num_elements == 0) {
LAB_00226a3b:
    plVar5 = local_f0;
    local_b0._0_8_ = local_a0 + 8;
    local_b0._8_8_ = 0;
    local_a0._0_8_ = 5;
    if (local_e8 != 0) {
      lVar29 = local_e8 << 3;
      lVar38 = 0;
      do {
        pDVar15 = *(Definition **)((long)plVar5 + lVar38);
        if ((this->paramOverrides).childNodes.
            super_sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
            .num_elements == 0) {
LAB_00226b37:
          paramOverrideNode = (ParamOverrideNode *)0x0;
        }
        else {
          pcVar14 = (pDVar15->name)._M_str;
          local_68._0_8_ = local_58;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_68,pcVar14,pcVar14 + (pDVar15->name)._M_len);
          iVar25 = ska::detailv3::
                   sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
                   ::find(&(this->paramOverrides).childNodes.
                           super_sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
                          ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_68);
          if ((InstanceSymbol *)local_68._0_8_ != (InstanceSymbol *)local_58) {
            operator_delete((void *)local_68._0_8_,local_58._0_8_ + 1);
          }
          if (iVar25.current ==
              (this->paramOverrides).childNodes.
              super_sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
              .entries +
              (this->paramOverrides).childNodes.
              super_sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
              .num_slots_minus_one +
              (long)(this->paramOverrides).childNodes.
                    super_sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
                    .max_lookups) goto LAB_00226b37;
          paramOverrideNode = &((iVar25.current)->field_1).value.second;
        }
        pIVar26 = InstanceSymbol::createDefault(this,pDVar15,paramOverrideNode);
        Scope::addMember(&((this->root)._M_t.
                           super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                           .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl)->
                          super_Scope,(Symbol *)pIVar26);
        local_68._0_8_ = pIVar26;
        SmallVectorBase<slang::ast::InstanceSymbol_const*>::
        emplace_back<slang::ast::InstanceSymbol_const*>
                  ((SmallVectorBase<slang::ast::InstanceSymbol_const*> *)local_b0,
                   (InstanceSymbol **)local_68);
        lVar38 = lVar38 + 8;
      } while (lVar29 != lVar38);
      bVar39 = local_e8 != 0;
      src = extraout_RDX_08;
      goto LAB_00226bbe;
    }
  }
  else if (local_e8 != 0) {
    plVar5 = local_f0 + local_e8;
    pDVar15 = (Definition *)(local_b0 + 0x10);
    plVar30 = local_f0;
    do {
      lVar29 = ((long *)*plVar30)[1];
      local_b0._0_8_ = pDVar15;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b0,lVar29,*(long *)*plVar30 + lVar29);
      pVar40 = ska::detailv3::
               sherwood_v3_table<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>>>
               ::
               emplace<std::__cxx11::string,ska::flat_hash_map<std::__cxx11::string,slang::ast::ParamOverrideNode,slang::Hasher<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>>::convertible_to_value>
                         ((sherwood_v3_table<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>>>
                           *)&(this->paramOverrides).childNodes,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_b0,(convertible_to_value *)local_68);
      if ((Definition *)local_b0._0_8_ != pDVar15) {
        operator_delete((void *)local_b0._0_8_,local_a0._0_8_ + 1);
      }
      psVar31 = local_110.entries + -1;
      lVar29 = 0x20;
      do {
        lVar29 = lVar29 + -0x20;
        psVar36 = psVar31 + 1;
        psVar31 = psVar31 + 1;
      } while (psVar36->distance_from_desired < '\0');
      src = (EVP_PKEY_CTX *)(local_110.num_slots_minus_one * 0x20);
      if (src + (long)local_110.max_lookups * 0x20 + lVar29 != (EVP_PKEY_CTX *)0x0) {
        psVar36 = (sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>
                   *)(src + (long)local_110.max_lookups * 0x20 + (long)local_110.entries);
        do {
          pcVar14 = (psVar31->field_1).value.first._M_str;
          args = (psVar31->field_1).value.second;
          local_b0._0_8_ = pDVar15;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b0,pcVar14,pcVar14 + (psVar31->field_1).value.first._M_len);
          pVar41 = ska::detailv3::
                   sherwood_v3_table<std::pair<std::__cxx11::string,slang::ConstantValue>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ConstantValue>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ConstantValue>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,slang::ConstantValue>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,slang::ConstantValue>>>>
                   ::emplace<std::__cxx11::string,slang::ConstantValue_const&>
                             ((sherwood_v3_table<std::pair<std::__cxx11::string,slang::ConstantValue>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ConstantValue>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ConstantValue>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,slang::ConstantValue>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,slang::ConstantValue>>>>
                               *)&((pVar40.first.current.current)->field_1).value.second,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_b0,args);
          src = pVar41._8_8_;
          if ((Definition *)local_b0._0_8_ != pDVar15) {
            operator_delete((void *)local_b0._0_8_,local_a0._0_8_ + 1);
            src = extraout_RDX_07;
          }
          do {
            psVar4 = psVar31 + 1;
            psVar31 = psVar31 + 1;
          } while (psVar4->distance_from_desired < '\0');
        } while (psVar31 != psVar36);
      }
      plVar30 = plVar30 + 1;
    } while (plVar30 != plVar5);
    goto LAB_00226a3b;
  }
  local_b0._0_8_ = local_a0 + 8;
  local_a0._0_8_ = 5;
  local_b0._8_8_ = 0;
  bVar39 = false;
LAB_00226bbe:
  if (((this->options).suppressUnused == false) && (!bVar39)) {
    Scope::addDiag(&((this->root)._M_t.
                     super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                     .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl)->
                    super_Scope,(DiagCode)0x16000d,(SourceLocation)0xffffffffffffffff);
    src = extraout_RDX_09;
  }
  ppDVar13 = (this->unreferencedDefs).
             super__Vector_base<const_slang::ast::Definition_*,_std::allocator<const_slang::ast::Definition_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  for (ppDVar32 = (this->unreferencedDefs).
                  super__Vector_base<const_slang::ast::Definition_*,_std::allocator<const_slang::ast::Definition_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppDVar32 != ppDVar13;
      ppDVar32 = ppDVar32 + 1) {
    pRVar10 = (this->root)._M_t.
              super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
              ._M_t.
              super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
              .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
    pIVar26 = InstanceSymbol::createInvalid(this,*ppDVar32);
    Scope::addMember(&pRVar10->super_Scope,(Symbol *)pIVar26);
    src = extraout_RDX_10;
  }
  iVar18 = SmallVectorBase<const_slang::ast::InstanceSymbol_*>::copy
                     ((SmallVectorBase<const_slang::ast::InstanceSymbol_*> *)local_b0,
                      (EVP_PKEY_CTX *)this,src);
  SVar35 = local_70;
  pRVar10 = (this->root)._M_t.
            super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
            ._M_t.
            super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
            .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
  (pRVar10->topInstances).data_ = (pointer)CONCAT44(extraout_var,iVar18);
  (pRVar10->topInstances).size_ = extraout_RDX_11;
  ppCVar16 = (this->compilationUnits).
             super__Vector_base<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppCVar17 = (this->compilationUnits).
             super__Vector_base<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  pRVar10 = (this->root)._M_t.
            super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
            ._M_t.
            super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
            .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
  (pRVar10->compilationUnits).data_ = ppCVar16;
  (pRVar10->compilationUnits).size_ = (long)ppCVar17 - (long)ppCVar16 >> 3;
  this->finalized = true;
  this->finalizing = false;
  if (local_70 != (SourceLocation)0x0) {
    local_68._0_8_ = &this->seenBindDirectives;
    local_68._8_8_ = ska::detailv3::empty_default_table<slang::ast::InstanceBodySymbol_const*>();
    local_58._0_8_ = 0;
    local_58._8_2_ = 0x33f;
    local_58._12_4_ = 0x3f000000;
    local_58._16_8_ = (char *)0x0;
    local_58._24_8_ = SVar35;
    local_58[0x20] = false;
    Symbol::visit<slang::ast::BindVisitor&>
              (&((this->root)._M_t.
                 super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                 .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl)->super_Symbol
               ,(BindVisitor *)local_68);
    ska::detailv3::
    sherwood_v3_table<const_slang::ast::InstanceBodySymbol_*,_const_slang::ast::InstanceBodySymbol_*,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>_>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>_>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*>_>_>
    ::~sherwood_v3_table
              ((sherwood_v3_table<const_slang::ast::InstanceBodySymbol_*,_const_slang::ast::InstanceBodySymbol_*,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>_>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>_>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*>_>_>
                *)(local_68 + 8));
  }
  pRVar10 = (this->root)._M_t.
            super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
            ._M_t.
            super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
            .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
  if ((Definition *)local_b0._0_8_ != (Definition *)(local_a0 + 8)) {
    free((void *)local_b0._0_8_);
  }
  if (local_f0 != local_d8) {
    free(local_f0);
  }
  this->finalizing = false;
  ska::detailv3::
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>_>_>
  ::~sherwood_v3_table(&local_110);
  return pRVar10;
}

Assistant:

const RootSymbol& Compilation::getRoot(bool skipDefParamResolution) {
    if (finalized)
        return *root;

    // If any top-level parameter overrides were provided, parse them now.
    flat_hash_map<string_view, const ConstantValue*> cliOverrides;
    parseParamOverrides(cliOverrides);

    // If there are defparams we need to fully resolve their values up front before
    // we start elaborating any instances.
    size_t numDefParams = 0, numBinds = 0;
    for (auto& tree : syntaxTrees) {
        auto& meta = tree->getMetadata();
        numDefParams += meta.defparams.size();
        numBinds += meta.bindDirectives.size();
    }

    if (!skipDefParamResolution && numDefParams)
        resolveDefParams(numDefParams);

    ASSERT(!finalizing);
    finalizing = true;
    auto guard = ScopeGuard([this] { finalizing = false; });

    auto isValidTop = [&](auto& definition) {
        // All parameters must have defaults.
        for (auto& param : definition.parameters) {
            if (!param.hasDefault() && cliOverrides.find(param.name) == cliOverrides.end())
                return false;
        }
        return true;
    };

    // Find top level modules that form the root of the design. Iterate the definitions
    // map before instantiating any top level modules, since that can cause changes
    // to the definition map itself.
    SmallVector<const Definition*> topDefs;
    if (options.topModules.empty()) {
        for (auto& [key, definition] : definitionMap) {
            // Ignore definitions that are not top level. Top level definitions are:
            // - Always modules
            // - Not nested
            // - Have no non-defaulted parameters
            // - Not instantiated anywhere
            if (std::get<1>(key) != root.get() ||
                globalInstantiations.find(definition->name) != globalInstantiations.end()) {
                continue;
            }

            // Library modules are never automatically instantiated in any capacity.
            if (!definition->syntaxTree || !definition->syntaxTree->isLibrary) {
                if (definition->definitionKind == DefinitionKind::Module) {
                    if (isValidTop(*definition)) {
                        // This module can be automatically instantiated.
                        topDefs.push_back(definition.get());
                        continue;
                    }
                }
            }

            // Otherwise this definition is unreferenced and not automatically instantiated.
            unreferencedDefs.push_back(definition.get());
        }
    }
    else {
        // If the list of top modules has already been provided we just need to
        // find and instantiate them.
        auto& tm = options.topModules;
        for (auto& [key, definition] : definitionMap) {
            if (std::get<1>(key) != root.get())
                continue;

            if (definition->definitionKind == DefinitionKind::Module) {
                if (auto it = tm.find(definition->name); it != tm.end()) {
                    // Remove from the top modules set so that we know we visited it.
                    tm.erase(it);

                    // Make sure this is actually valid as a top-level module.
                    if (isValidTop(*definition)) {
                        topDefs.push_back(definition.get());
                        continue;
                    }

                    // Otherwise, issue an error because the user asked us to instantiate this.
                    definition->scope.addDiag(diag::InvalidTopModule, SourceLocation::NoLocation)
                        << definition->name;
                }
            }

            // Otherwise this definition might be unreferenced and not automatically instantiated.
            if (globalInstantiations.find(definition->name) == globalInstantiations.end())
                unreferencedDefs.push_back(definition.get());
        }

        // If any top modules were not found, issue an error.
        for (auto& name : tm)
            root->addDiag(diag::InvalidTopModule, SourceLocation::NoLocation) << name;
    }

    // Sort the list of definitions so that we get deterministic ordering of instances;
    // the order is otherwise dependent on iterating over a hash table.
    auto byName = [](auto a, auto b) { return a->name < b->name; };
    std::sort(topDefs.begin(), topDefs.end(), byName);
    std::sort(unreferencedDefs.begin(), unreferencedDefs.end(), byName);

    // If we have any cli param overrides we should apply them to
    // each top-level instance.
    if (!cliOverrides.empty()) {
        for (auto def : topDefs) {
            auto& node = paramOverrides.childNodes[std::string(def->name)];
            for (auto [name, value] : cliOverrides)
                node.overrides.emplace(std::string(name), *value);
        }
    }

    SmallVector<const InstanceSymbol*> topList;
    for (auto def : topDefs) {
        const ParamOverrideNode* paramOverrideNode = nullptr;
        if (!paramOverrides.childNodes.empty()) {
            if (auto it = paramOverrides.childNodes.find(std::string(def->name));
                it != paramOverrides.childNodes.end()) {
                paramOverrideNode = &it->second;
            }
        }

        auto& instance = InstanceSymbol::createDefault(*this, *def, paramOverrideNode);
        root->addMember(instance);
        topList.push_back(&instance);
    }

    if (!options.suppressUnused && topDefs.empty())
        root->addDiag(diag::NoTopModules, SourceLocation::NoLocation);

    // For unreferenced definitions, go through and instantiate them with all empty
    // parameter values so that we get at least some semantic checking of the contents.
    for (auto def : unreferencedDefs)
        root->addMember(InstanceSymbol::createInvalid(*this, *def));

    root->topInstances = topList.copy(*this);
    root->compilationUnits = compilationUnits;
    finalizing = false;
    finalized = true;

    // If there are any bind directives in the design, we need to opportunistically
    // traverse the hierarchy now to find them (because they can modify the hierarchy and
    // accessing other nodes / expressions might not be valid without those bound
    // instances present).
    if (numBinds) {
        BindVisitor visitor(seenBindDirectives, numBinds);
        root->visit(visitor);
    }

    return *root;
}